

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_25::CppCodeGenerator::GenerateCode
          (CppCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  string *__rhs;
  bool bVar1;
  Status SVar2;
  string cpp_std;
  IDLOptionsCpp local_cb8;
  CppGenerator generator;
  IDLOptionsCpp local_338;
  
  cpp::IDLOptionsCpp::IDLOptionsCpp(&local_cb8,&parser->opts);
  __rhs = &local_cb8.super_IDLOptions.cpp_std;
  if (local_cb8.super_IDLOptions.cpp_std._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cpp_std,"C++11",(allocator<char> *)&generator);
  }
  else {
    std::__cxx11::string::string((string *)&cpp_std,(string *)__rhs);
  }
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )cpp_std._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(cpp_std._M_dataplus._M_p + cpp_std._M_string_length),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )cpp_std._M_dataplus._M_p,CharToUpper);
  bVar1 = std::operator==(&cpp_std,"C++0X");
  if (bVar1) {
    local_cb8.super_IDLOptions._780_4_ = 0;
    bVar1 = true;
    local_cb8.g_only_fixed_enums = false;
LAB_0014e55e:
    local_cb8.g_only_fixed_enums =
         (bool)(local_cb8.g_only_fixed_enums | local_cb8.super_IDLOptions.scoped_enums);
    if ((!bVar1) || (local_cb8.super_IDLOptions.cpp_static_reflection == false)) {
      cpp::IDLOptionsCpp::IDLOptionsCpp(&local_338,&local_cb8);
      cpp::CppGenerator::CppGenerator(&generator,parser,path,filename,&local_338);
      IDLOptions::~IDLOptions(&local_338.super_IDLOptions);
      bVar1 = cpp::CppGenerator::generate(&generator);
      cpp::CppGenerator::~CppGenerator(&generator);
      SVar2 = (Status)!bVar1;
      goto LAB_0014e63a;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&generator,
               "--cpp-static-reflection requires using --cpp-std at \"C++17\" or higher.",
               (allocator<char> *)&local_338);
    LogCompilerError((string *)&generator);
  }
  else {
    bVar1 = std::operator==(&cpp_std,"C++11");
    if (bVar1) {
      local_cb8.super_IDLOptions._780_4_ = 1;
      bVar1 = true;
      local_cb8.g_only_fixed_enums = true;
      goto LAB_0014e55e;
    }
    bVar1 = std::operator==(&cpp_std,"C++17");
    if (bVar1) {
      local_cb8.super_IDLOptions._780_4_ = 2;
      local_cb8.super_IDLOptions.prefixed_enums = false;
      local_cb8.super_IDLOptions.scoped_enums = true;
      bVar1 = false;
      goto LAB_0014e55e;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&generator,
                   "Unknown value of the \'--cpp-std\' switch: ",__rhs);
    LogCompilerError((string *)&generator);
  }
  std::__cxx11::string::~string((string *)&generator);
  SVar2 = ERROR;
LAB_0014e63a:
  std::__cxx11::string::~string((string *)&cpp_std);
  IDLOptions::~IDLOptions(&local_cb8.super_IDLOptions);
  return SVar2;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateCPP(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }